

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O1

size_t __thiscall
ddd::DaTrie<false,_false,_true>::edge_size_
          (DaTrie<false,_false,_true> *this,uint32_t node_pos,size_t upper)

{
  ulong uVar1;
  pointer pBVar2;
  Bc BVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  bool bVar7;
  
  pBVar2 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  BVar3 = pBVar2[node_pos];
  if ((long)BVar3 < 0) {
    uVar5 = BVar3._0_4_;
    if (((int)uVar5 < 0) || (uVar5 == 0x7fffffff)) {
      uVar4 = 0;
    }
    else {
      uVar4 = 0;
      uVar6 = 0;
      do {
        uVar1 = uVar4 + 1;
        bVar7 = (*(uint *)&pBVar2[uVar6 ^ uVar5].field_0x4 & 0x7fffffff) == node_pos;
        if (bVar7) {
          uVar4 = uVar1;
        }
      } while ((!bVar7 || uVar1 < upper) && (bVar7 = uVar6 != 0xff, uVar6 = uVar6 + 1, bVar7));
    }
    return uVar4;
  }
  __assert_fail("bc_[node_pos].is_fixed()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                ,0x3f8,
                "size_t ddd::DaTrie<false, false, true>::edge_size_(uint32_t, size_t) const [WithBLM = false, WithNLM = false, Prefix = true]"
               );
}

Assistant:

size_t edge_size_(uint32_t node_pos, size_t upper = 256) const {
    assert(bc_[node_pos].is_fixed());

    if (bc_[node_pos].is_leaf()) {
      return 0;
    }

    auto base = bc_[node_pos].base();
    if (base == INVALID_VALUE) { // for prefix subtrie
      return 0;
    }

    size_t size = 0;
    if (WithNLM) {
      auto child_pos = base ^node_links_[node_pos].child;
      while (++size < upper && node_links_[child_pos].sib != node_links_[node_pos].child) {
        child_pos = base ^ node_links_[child_pos].sib;
      }
    } else {
      for (uint32_t label = 0; label < 256; ++label) {
        auto child_pos = base ^label;
        if (bc_[child_pos].check() == node_pos && ++size >= upper) {
          break;
        }
      }
    }
    return size;
  }